

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_configmanager.cpp
# Opt level: O0

void cali::internal::init_builtin_configmanager(Caliper *c)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Events *pEVar3;
  ostream *poVar4;
  socklen_t __len;
  sockaddr *__addr;
  Log local_4e8;
  anon_class_24_2_4d84504c local_2e0;
  function<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView)> local_2c8;
  undefined1 local_2a8 [8];
  Channel channel;
  string local_290 [32];
  Node *local_270;
  Attribute flag_attr;
  string local_260;
  Log local_240;
  undefined1 local_28 [8];
  ConfigManager mgr;
  char *configstr;
  Caliper *c_local;
  
  mgr.mP.super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)getenv("CALI_CONFIG");
  if (mgr.mP.super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ConfigManager::ConfigManager((ConfigManager *)local_28);
    ConfigManager::add((ConfigManager *)local_28,
                       (char *)mgr.mP.
                               super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
    bVar1 = ConfigManager::error((ConfigManager *)local_28);
    if (bVar1) {
      Log::Log(&local_240,0);
      poVar4 = Log::stream(&local_240);
      poVar4 = std::operator<<(poVar4,"CALI_CONFIG: error: ");
      ConfigManager::error_msg_abi_cxx11_(&local_260,(ConfigManager *)local_28);
      poVar4 = std::operator<<(poVar4,(string *)&local_260);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_260);
      Log::~Log(&local_240);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_290,"cali.configmgr.flushed",
                 (allocator<char> *)
                 ((long)&channel.mP.
                         super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      __len = 0xc1;
      iVar2 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                        (c,local_290,7,0xc1,0,0,0);
      local_270 = (Node *)CONCAT44(extraout_var,iVar2);
      std::__cxx11::string::~string(local_290);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&channel.mP.
                         super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      anon_unknown.dwarf_3b70b8::make_flush_trigger_channel
                ((anon_unknown_dwarf_3b70b8 *)local_2a8,c);
      ConfigManager::start((ConfigManager *)local_28);
      pEVar3 = Channel::events((Channel *)local_2a8);
      ConfigManager::ConfigManager(&local_2e0.mgr,(ConfigManager *)local_28);
      local_2e0.flag_attr.m_node = local_270;
      std::function<void(cali::Caliper*,cali::ChannelBody*,cali::SnapshotView)>::
      function<cali::internal::init_builtin_configmanager(cali::Caliper*)::__0,void>
                ((function<void(cali::Caliper*,cali::ChannelBody*,cali::SnapshotView)> *)&local_2c8,
                 &local_2e0);
      util::callback<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView)>::connect
                (&pEVar3->write_output_evt,(int)&local_2c8,__addr,__len);
      std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView)>::~function
                (&local_2c8);
      init_builtin_configmanager(cali::Caliper*)::$_0::~__0((__0 *)&local_2e0);
      Log::Log(&local_4e8,1);
      poVar4 = Log::stream(&local_4e8);
      poVar4 = std::operator<<(poVar4,"Registered builtin ConfigManager");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      Log::~Log(&local_4e8);
      Channel::~Channel((Channel *)local_2a8);
    }
    flag_attr.m_node._5_3_ = 0;
    flag_attr.m_node._4_1_ = bVar1;
    ConfigManager::~ConfigManager((ConfigManager *)local_28);
  }
  return;
}

Assistant:

void init_builtin_configmanager(Caliper* c)
{
    const char* configstr = std::getenv("CALI_CONFIG");

    if (!configstr)
        return;

    ConfigManager mgr;
    mgr.add(configstr);

    if (mgr.error()) {
        Log(0).stream() << "CALI_CONFIG: error: " << mgr.error_msg() << std::endl;
        return;
    }

    //   Make a channel to trigger the ConfigManager flush. Use the mpiflush
    // service if it is available to trigger flushes at MPI_Finalize(). In
    // that case, set the configmgr.flushed attribute to skip flushing at the
    // end of the program.

    Attribute flag_attr = c->create_attribute(
        "cali.configmgr.flushed",
        CALI_TYPE_BOOL,
        CALI_ATTR_SKIP_EVENTS | CALI_ATTR_HIDDEN | CALI_ATTR_ASVALUE
    );

    Channel channel = ::make_flush_trigger_channel(c);

    mgr.start();

    channel.events().write_output_evt.connect([mgr, flag_attr](Caliper* c, ChannelBody* chB, SnapshotView) mutable {
        if (c->get(chB, flag_attr).value().to_bool() == true)
            return;

        mgr.flush();

        c->set(chB, flag_attr, Variant(true));
    });

    Log(1).stream() << "Registered builtin ConfigManager" << std::endl;
}